

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O0

pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_bool>
 __thiscall
llvm::
StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
::try_emplace<>(StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
                *this,StringRef Key)

{
  StringMapEntryBase *pSVar1;
  MallocAllocator *pMVar2;
  StringMapEntryBase *pSVar3;
  MallocAllocator *Allocator;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>
  *pSVar4;
  uint uVar5;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_bool>
  pVar6;
  StringRef Key_00;
  bool local_89;
  StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>
  local_88;
  StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
  *local_80;
  char *local_78;
  bool local_59;
  StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>
  local_58;
  StringMapEntryBase **local_50;
  StringMapEntryBase **Bucket;
  char *local_40;
  uint local_34;
  StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
  *pSStack_30;
  uint BucketNo;
  StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
  *this_local;
  StringRef Key_local;
  undefined1 local_10;
  
  local_40 = (char *)Key.Length;
  Bucket = (StringMapEntryBase **)Key.Data;
  pSStack_30 = this;
  this_local = (StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
                *)Bucket;
  Key_local.Data = local_40;
  local_34 = StringMapImpl::LookupBucketFor(&this->super_StringMapImpl,Key);
  local_50 = (this->super_StringMapImpl).TheTable + local_34;
  if (*local_50 != (StringMapEntryBase *)0x0) {
    pSVar1 = *local_50;
    pSVar3 = StringMapImpl::getTombstoneVal();
    if (pSVar1 != pSVar3) {
      StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>
      ::StringMapIterator(&local_58,(this->super_StringMapImpl).TheTable + local_34,false);
      local_59 = false;
      pVar6 = std::
              make_pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,std::default_delete<llbuild::buildsystem::Target>>>,bool>
                        (&local_58,&local_59);
      local_10 = pVar6.second;
      goto LAB_001e72fb;
    }
  }
  pMVar2 = (MallocAllocator *)*local_50;
  Allocator = (MallocAllocator *)StringMapImpl::getTombstoneVal();
  if (pMVar2 == Allocator) {
    uVar5 = (this->super_StringMapImpl).NumTombstones - 1;
    Allocator = (MallocAllocator *)(ulong)uVar5;
    (this->super_StringMapImpl).NumTombstones = uVar5;
  }
  local_80 = this_local;
  local_78 = Key_local.Data;
  Key_00.Length = &this->field_0x18;
  Key_00.Data = Key_local.Data;
  pSVar4 = StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>
           ::Create<llvm::MallocAllocator>
                     ((StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>
                       *)this_local,Key_00,Allocator);
  *local_50 = &pSVar4->super_StringMapEntryBase;
  (this->super_StringMapImpl).NumItems = (this->super_StringMapImpl).NumItems + 1;
  if ((this->super_StringMapImpl).NumBuckets <
      (this->super_StringMapImpl).NumItems + (this->super_StringMapImpl).NumTombstones) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Target>>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = std::unique_ptr<llbuild::buildsystem::Target>, AllocatorTy = llvm::MallocAllocator, ArgsTy = <>]"
                 );
  }
  local_34 = StringMapImpl::RehashTable(&this->super_StringMapImpl,local_34);
  StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>
  ::StringMapIterator(&local_88,(this->super_StringMapImpl).TheTable + local_34,false);
  local_89 = true;
  pVar6 = std::
          make_pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,std::default_delete<llbuild::buildsystem::Target>>>,bool>
                    (&local_88,&local_89);
  local_10 = pVar6.second;
LAB_001e72fb:
  Key_local.Length =
       (size_t)pVar6.first.
               super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
               .Ptr;
  pVar6.second = (bool)local_10;
  pVar6.first.
  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
          )(StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
            )Key_local.Length;
  return pVar6;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }